

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O2

void __thiscall
RigidBodyDynamics::Errors::RBDLSizeMismatchError::~RBDLSizeMismatchError
          (RBDLSizeMismatchError *this)

{
  RBDLError::~RBDLError(&this->super_RBDLError);
  operator_delete(this,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLSizeMismatchError : public RBDLError
{
public:
  RBDLSizeMismatchError(std::string text);
}